

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxClassTypeCast::FxClassTypeCast(FxClassTypeCast *this,PClassPointer *dtype,FxExpression *x)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&x->ScriptPosition);
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_ClassTypeCast;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxClassTypeCast_0070d100;
  (this->super_FxExpression).ValueType = (PType *)dtype;
  this->desttype = dtype->ClassRestriction;
  this->basex = x;
  return;
}

Assistant:

FxClassTypeCast::FxClassTypeCast(PClassPointer *dtype, FxExpression *x)
: FxExpression(EFX_ClassTypeCast, x->ScriptPosition)
{
	ValueType = dtype;
	desttype = dtype->ClassRestriction;
	basex=x;
}